

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O2

void anon_unknown.dwarf_1173f9::brotli_context::_compress
               (h2o_compress_context_t *self,h2o_iovec_t *inbufs,size_t inbufcnt,
               h2o_send_state_t state,h2o_iovec_t **outbufs,size_t *outbufcnt)

{
  size_t *psVar1;
  BrotliCompressor *pBVar2;
  size_t sVar3;
  ulong input_size;
  size_t sVar4;
  h2o_iovec_t *phVar5;
  ulong uVar6;
  bool bVar7;
  
  if (self[1].name.base == (char *)0x0) {
    if (state != H2O_SEND_STATE_IN_PROGRESS) {
      psVar1 = &inbufs->len;
      sVar4 = 0;
      sVar3 = inbufcnt;
      while (bVar7 = sVar3 != 0, sVar3 = sVar3 - 1, bVar7) {
        sVar4 = sVar4 + *psVar1;
        psVar1 = psVar1 + 2;
      }
      if (sVar4 != 0xffffffffffffffff) {
        _update_lgwin((BrotliParams *)&self[1].name.len,sVar4);
      }
    }
    pBVar2 = (BrotliCompressor *)operator_new(0x1448);
    brotli::BrotliCompressor::BrotliCompressor(pBVar2,*(BrotliParams *)&self[1].name.len);
    self[1].name.base = (char *)pBVar2;
  }
  _clear_bufs((brotli_context *)self);
  if (inbufcnt == 0) {
    if (state == H2O_SEND_STATE_IN_PROGRESS) goto LAB_001818cd;
    _emit((brotli_context *)self,true,false);
  }
  else {
    uVar6 = 1L << (self[1].name.base[0xc] & 0x3fU);
    sVar3 = 0;
    do {
      phVar5 = inbufs + sVar3;
      sVar4 = 0;
      do {
        if (sVar3 == inbufcnt) goto LAB_0018186d;
        input_size = phVar5->len - sVar4;
        if (uVar6 <= input_size) {
          input_size = uVar6;
        }
        brotli::BrotliCompressor::CopyInputToRingBuffer
                  ((BrotliCompressor *)self[1].name.base,input_size,
                   (uint8_t *)(phVar5->base + sVar4));
        sVar4 = sVar4 + input_size;
      } while (phVar5->len != sVar4);
      sVar3 = sVar3 + 1;
    } while (sVar3 != inbufcnt);
LAB_0018186d:
    _emit((brotli_context *)self,state != H2O_SEND_STATE_IN_PROGRESS,
          state == H2O_SEND_STATE_IN_PROGRESS);
    if (state == H2O_SEND_STATE_IN_PROGRESS) goto LAB_001818cd;
  }
  pBVar2 = (BrotliCompressor *)self[1].name.base;
  if (pBVar2 != (BrotliCompressor *)0x0) {
    brotli::BrotliCompressor::~BrotliCompressor(pBVar2);
  }
  operator_delete(pBVar2,0x1448);
  self[1].name.base = (char *)0x0;
LAB_001818cd:
  phVar5 = (h2o_iovec_t *)self[2].name.len;
  *outbufs = phVar5;
  *outbufcnt = (long)self[2].transform - (long)phVar5 >> 4;
  return;
}

Assistant:

static void _compress(h2o_compress_context_t *self, h2o_iovec_t *inbufs, size_t inbufcnt, h2o_send_state_t state,
                              h2o_iovec_t **outbufs, size_t *outbufcnt) {
            static_cast<brotli_context*>(self)->_compress(inbufs, inbufcnt, !h2o_send_state_is_in_progress(state), outbufs, outbufcnt);
        }